

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory_stream.cpp
# Opt level: O3

void __thiscall
duckdb::MemoryStream::ReadData(MemoryStream *this,data_ptr_t destination,idx_t read_size)

{
  SerializationException *this_00;
  string local_40;
  
  if (this->position + read_size <= this->capacity) {
    switchD_015de399::default(destination,this->data + this->position,read_size);
    this->position = this->position + read_size;
    return;
  }
  this_00 = (SerializationException *)__cxa_allocate_exception(0x10);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,
             "Failed to deserialize: not enough data in buffer to fulfill read request","");
  SerializationException::SerializationException(this_00,&local_40);
  __cxa_throw(this_00,&SerializationException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void MemoryStream::ReadData(data_ptr_t destination, idx_t read_size) {
	if (position + read_size > capacity) {
		throw SerializationException("Failed to deserialize: not enough data in buffer to fulfill read request");
	}
	memcpy(destination, data + position, read_size);
	position += read_size;
}